

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O1

void apply_pitch_modifications
               (DUMB_IT_SIGDATA *sigdata,IT_PLAYING *playing,double *delta,int *cutoff)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  char *pcVar5;
  double dVar6;
  
  switch(playing->sample_vibrato_waveform) {
  case '\x01':
    uVar3 = (ulong)playing->sample_vibrato_time;
    pcVar5 = 
    "@??>>==<<;;::99887766554433221100//..--,,++**))((\'\'&&%%$$##\"\"!!  \x1f\x1f\x1e\x1e\x1d\x1d\x1c\x1c\x1b\x1b\x1a\x1a\x19\x19\x18\x18\x17\x17\x16\x16\x15\x15\x14\x14\x13\x13\x12\x12\x11\x11\x10\x10\x0f\x0f\x0e\x0e\r\r\f\f\v\v\n\n\t\t\b\b\a\a\x06\x06\x05\x05\x04\x04\x03\x03\x02\x02\x01\x01"
    ;
    break;
  case '\x02':
    uVar3 = (ulong)playing->sample_vibrato_time;
    pcVar5 = 
    "@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@"
    ;
    break;
  case '\x03':
    iVar4 = rand();
    iVar4 = iVar4 % 0x81 + -0x40;
    goto LAB_006ec45f;
  case '\x04':
    uVar3 = (ulong)playing->sample_vibrato_time;
    pcVar5 = it_xm_squarewave;
    break;
  case '\x05':
    uVar3 = (ulong)playing->sample_vibrato_time;
    goto LAB_006ec446;
  case '\x06':
    uVar3 = (ulong)playing->sample_vibrato_time ^ 0xff;
LAB_006ec446:
    pcVar5 = "";
    break;
  default:
    uVar3 = (ulong)playing->sample_vibrato_time;
    pcVar5 = "";
  }
  iVar4 = (int)pcVar5[uVar3];
LAB_006ec45f:
  if ((sigdata->flags & 0x40U) == 0) {
    uVar2 = playing->sample_vibrato_depth >> 8;
  }
  else {
    uVar2 = (uint)playing->sample->vibrato_depth;
    bVar1 = playing->sample->vibrato_rate;
    if (bVar1 != 0) {
      uVar2 = (int)(uVar2 * playing->sample_vibrato_depth) / (int)(uint)bVar1;
    }
  }
  if (0xf < uVar2 * iVar4) {
    iVar4 = (int)(uVar2 * iVar4) >> 4;
    if ((sigdata->flags & 0x48U) == 0x40) {
      dVar6 = (double)((float)iVar4 * -1.7621046e-08) + (double)(1.5258789e-05 / playing->delta);
      if (dVar6 <= 4.656754981624545e-10) {
        dVar6 = 4.656754981624545e-10;
      }
      dVar6 = (*delta * 1.52587890625e-05) / (dVar6 * (double)playing->delta);
    }
    else {
      dVar6 = exp2((double)iVar4 * 0.0003255208333333158);
      dVar6 = (double)(float)dVar6 * *delta;
    }
    *delta = dVar6;
  }
  if ((playing->env_instrument != (IT_INSTRUMENT *)0x0) && ((playing->enabled_envelopes & 4) != 0))
  {
    iVar4 = (playing->pitch_envelope).value;
    if ((char)(playing->env_instrument->pitch_envelope).flags < '\0') {
      *cutoff = (iVar4 + 0x2000) * *cutoff >> 0xe;
    }
    else {
      dVar6 = exp2((double)(iVar4 >> 1) * 0.0003255208333333158);
      *delta = (double)(float)dVar6 * *delta;
    }
  }
  return;
}

Assistant:

static void apply_pitch_modifications(DUMB_IT_SIGDATA *sigdata, IT_PLAYING *playing, double *delta, int *cutoff)
{
	{
		int sample_vibrato_shift;
		switch (playing->sample_vibrato_waveform)
		{
		default:
			sample_vibrato_shift = it_sine[playing->sample_vibrato_time];
			break;
		case 1:
			sample_vibrato_shift = it_sawtooth[playing->sample_vibrato_time];
			break;
		case 2:
			sample_vibrato_shift = it_squarewave[playing->sample_vibrato_time];
			break;
		case 3:
			sample_vibrato_shift = (rand() % 129) - 64;
			break;
		case 4:
			sample_vibrato_shift = it_xm_squarewave[playing->sample_vibrato_time];
			break;
		case 5:
			sample_vibrato_shift = it_xm_ramp[playing->sample_vibrato_time];
			break;
		case 6:
			sample_vibrato_shift = it_xm_ramp[255-playing->sample_vibrato_time];
			break;
		}

		if (sigdata->flags & IT_WAS_AN_XM) {
			int depth = playing->sample->vibrato_depth; /* True depth */
			if (playing->sample->vibrato_rate) {
				depth *= playing->sample_vibrato_depth; /* Tick number */
				depth /= playing->sample->vibrato_rate; /* XM sweep */
			}
			sample_vibrato_shift *= depth;
		} else
			sample_vibrato_shift *= playing->sample_vibrato_depth >> 8;

		sample_vibrato_shift >>= 4;

		if (sample_vibrato_shift) {
			if ((sigdata->flags & IT_LINEAR_SLIDES) || !(sigdata->flags & IT_WAS_AN_XM))
				*delta *= (float)pow(DUMB_PITCH_BASE, sample_vibrato_shift);
			else {
				/* complicated! */
				double scale = *delta / playing->delta;

				*delta = (1.0f / 65536.0f) / playing->delta;

				*delta -= sample_vibrato_shift / AMIGA_DIVISOR;

				if (*delta < (1.0f / 65536.0f) / 32767.0f) {
					*delta = (1.0f / 65536.0f) / 32767.0f;
				}

				*delta = (1.0f / 65536.0f) / *delta * scale;
			}
		}
	}

	if (playing->env_instrument &&
		(playing->enabled_envelopes & IT_ENV_PITCH))
	{
		int p = envelope_get_y(&playing->env_instrument->pitch_envelope, &playing->pitch_envelope);
		if (playing->env_instrument->pitch_envelope.flags & IT_ENVELOPE_PITCH_IS_FILTER)
			*cutoff = (*cutoff * (p+(32<<IT_ENVELOPE_SHIFT))) >> (6 + IT_ENVELOPE_SHIFT);
		else
			*delta *= (float)pow(DUMB_PITCH_BASE, p >> (IT_ENVELOPE_SHIFT - 7));
	}
}